

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectgenerator.cpp
# Opt level: O1

bool __thiscall ProjectGenerator::addFile(ProjectGenerator *this,QString file)

{
  char16_t *pcVar1;
  undefined1 *puVar2;
  char cVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  pointer pQVar7;
  QList<ProString> *this_00;
  QArrayData *pQVar8;
  ulong uVar9;
  QString *in_RSI;
  ProjectGenerator *this_01;
  char *str;
  long in_FS_OFFSET;
  QStringView QVar10;
  QByteArrayView QVar11;
  QStringView QVar12;
  ProKey where;
  QString local_d0;
  QString local_b8;
  undefined1 local_98 [32];
  undefined1 *puStack_78;
  undefined1 *local_70;
  undefined1 local_68 [28];
  int iStack_4c;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  MakefileGenerator::fileFixify
            ((QString *)local_68,&this->super_MakefileGenerator,in_RSI,(FileFixifyTypes)0x2,true);
  pQVar8 = &((in_RSI->d).d)->super_QArrayData;
  pcVar1 = (in_RSI->d).ptr;
  (in_RSI->d).d = (Data *)local_68._0_8_;
  (in_RSI->d).ptr = (char16_t *)local_68._8_8_;
  puVar2 = (undefined1 *)(in_RSI->d).size;
  (in_RSI->d).size = local_68._16_8_;
  local_68._0_8_ = pQVar8;
  local_68._8_8_ = pcVar1;
  local_68._16_8_ = puVar2;
  if (pQVar8 != (QArrayData *)0x0) {
    LOCK();
    (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar8,2,0x10);
    }
  }
  iVar6 = QString::lastIndexOf((QString *)in_RSI,0x2e2bf0,(CaseSensitivity)(in_RSI->d).size);
  pQVar8 = (QArrayData *)0x0;
  if (iVar6 != -1) {
    QString::left((QString *)local_68,in_RSI,(long)(iVar6 + 1));
    pQVar8 = (QArrayData *)local_68._0_8_;
  }
  QString::mid((longlong)local_68,(longlong)in_RSI);
  if (local_68._16_8_ == Option::h_moc_mod.d.size) {
    QVar10.m_data = (storage_type_conflict *)local_68._8_8_;
    QVar10.m_size = local_68._16_8_;
    QVar12.m_data = Option::h_moc_mod.d.ptr;
    QVar12.m_size = Option::h_moc_mod.d.size;
    cVar3 = QtPrivate::equalStrings(QVar10,QVar12);
  }
  else {
    cVar3 = '\0';
  }
  if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
    }
  }
  if (cVar3 != '\0') {
    bVar4 = false;
    goto LAB_001a3deb;
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffffb0 = &DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  ProString::ProString((ProString *)local_68);
  if (Option::cpp_ext.d.size != 0) {
    iVar6 = 0;
    uVar9 = 0;
    do {
      pQVar7 = QList<QString>::data(&Option::cpp_ext);
      cVar3 = QString::endsWith((QString *)in_RSI,(int)pQVar7 + iVar6);
      if (cVar3 != '\0') {
        ProKey::ProKey((ProKey *)local_98,"SOURCES");
        QString::operator=((QString *)local_68,(QString *)local_98);
        stack0xffffffffffffffb0 = (undefined1 *)local_98._24_8_;
        local_48 = puStack_78;
        puStack_40 = local_70;
        if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
          }
        }
        break;
      }
      uVar9 = uVar9 + 1;
      iVar6 = iVar6 + 0x18;
    } while (uVar9 < (ulong)Option::cpp_ext.d.size);
  }
  if ((iStack_4c == 0) && (Option::h_ext.d.size != 0)) {
    iVar6 = 0;
    uVar9 = 0;
    do {
      cVar3 = QString::endsWith((QString *)in_RSI,(int)Option::h_ext.d.ptr + iVar6);
      if (cVar3 != '\0') {
        ProKey::ProKey((ProKey *)local_98,"HEADERS");
        QString::operator=((QString *)local_68,(QString *)local_98);
        unique0x10000622 = (undefined1 *)local_98._24_8_;
        local_48 = puStack_78;
        puStack_40 = local_70;
        if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
          }
        }
        break;
      }
      uVar9 = uVar9 + 1;
      iVar6 = iVar6 + 0x18;
    } while (uVar9 < (ulong)Option::h_ext.d.size);
  }
  if ((iStack_4c == 0) && (Option::c_ext.d.size != 0)) {
    iVar6 = 0;
    uVar9 = 0;
    do {
      pQVar7 = QList<QString>::data(&Option::c_ext);
      cVar3 = QString::endsWith((QString *)in_RSI,(int)pQVar7 + iVar6);
      if (cVar3 != '\0') {
        ProKey::ProKey((ProKey *)local_98,"SOURCES");
        QString::operator=((QString *)local_68,(QString *)local_98);
        unique0x10000642 = (undefined1 *)local_98._24_8_;
        local_48 = puStack_78;
        puStack_40 = local_70;
        if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
          }
        }
        break;
      }
      uVar9 = uVar9 + 1;
      iVar6 = iVar6 + 0x18;
    } while (uVar9 < (ulong)Option::c_ext.d.size);
  }
  if (iStack_4c == 0) {
    cVar3 = QString::endsWith((QString *)in_RSI,0x2e2aa0);
    if (cVar3 == '\0') {
      cVar3 = QString::endsWith((QString *)in_RSI,0x2e2ba0);
      if (cVar3 == '\0') {
        cVar3 = QString::endsWith((QString *)in_RSI,0x2e2bc0);
        if (cVar3 == '\0') {
          QVar11.m_data = (storage_type *)0x3;
          QVar11.m_size = (qsizetype)local_98;
          QString::fromUtf8(QVar11);
          local_b8.d.d = (Data *)local_98._0_8_;
          local_b8.d.ptr = (char16_t *)local_98._8_8_;
          local_b8.d.size = local_98._16_8_;
          cVar5 = QString::endsWith((QString *)in_RSI,(CaseSensitivity)&local_b8);
          cVar3 = '\x01';
          if (cVar5 == '\0') {
            QString::QString(&local_d0,".xlf");
            cVar3 = QString::endsWith((QString *)in_RSI,(CaseSensitivity)&local_d0);
            if (&(local_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_d0.d.d)->super_QArrayData,2,0x10);
              }
            }
          }
          if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (cVar3 == '\0') {
            QString::QString((QString *)local_98,".qrc");
            cVar3 = QString::endsWith((QString *)in_RSI,(CaseSensitivity)(QString *)local_98);
            if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
              }
            }
            if (cVar3 == '\0') goto LAB_001a3cc6;
            str = "RESOURCES";
          }
          else {
            str = "TRANSLATIONS";
          }
        }
        else {
          str = "YACCSOURCES";
        }
      }
      else {
        str = "LEXSOURCES";
      }
    }
    else {
      str = "FORMS";
    }
    ProKey::ProKey((ProKey *)local_98,str);
    QString::operator=((QString *)local_68,(QString *)local_98);
    unique0x10000682 = (undefined1 *)local_98._24_8_;
    local_48 = puStack_78;
    puStack_40 = local_70;
    if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
      }
    }
  }
LAB_001a3cc6:
  local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  this_01 = this;
  MakefileGenerator::fileFixify
            ((QString *)local_98,&this->super_MakefileGenerator,in_RSI,(FileFixifyTypes)0x0,true);
  fixPathToQmake(&local_b8,this_01,(QString *)local_98);
  if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
    }
  }
  this_00 = &QMakeEvaluator::valuesRef
                       (&((this->super_MakefileGenerator).project)->super_QMakeEvaluator,
                        (ProKey *)local_68)->super_QList<ProString>;
  bVar4 = ProStringList::contains((ProStringList *)this_00,&local_b8,CaseInsensitive);
  if (!bVar4) {
    ProString::ProString((ProString *)local_98,&local_b8);
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
              ((QMovableArrayOps<ProString> *)this_00,(this_00->d).size,(ProString *)local_98);
    QList<ProString>::end(this_00);
    if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
      }
    }
  }
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
    }
  }
  bVar4 = !bVar4;
LAB_001a3deb:
  if (pQVar8 != (QArrayData *)0x0) {
    LOCK();
    (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar8,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool
ProjectGenerator::addFile(QString file)
{
    file = fileFixify(file, FileFixifyToIndir);
    QString dir;
    int s = file.lastIndexOf(Option::dir_sep);
    if(s != -1)
        dir = file.left(s+1);
    if(file.mid(dir.size(), Option::h_moc_mod.size()) == Option::h_moc_mod)
        return false;

    ProKey where;
    for(int cppit = 0; cppit < Option::cpp_ext.size(); ++cppit) {
        if(file.endsWith(Option::cpp_ext[cppit])) {
            where = "SOURCES";
            break;
        }
    }
    if(where.isEmpty()) {
        for(int hit = 0; hit < Option::h_ext.size(); ++hit)
            if(file.endsWith(Option::h_ext.at(hit))) {
                where = "HEADERS";
                break;
            }
    }
    if(where.isEmpty()) {
        for(int cit = 0; cit < Option::c_ext.size(); ++cit) {
            if(file.endsWith(Option::c_ext[cit])) {
                where = "SOURCES";
                break;
            }
        }
    }
    if(where.isEmpty()) {
        if(file.endsWith(Option::ui_ext))
            where = "FORMS";
        else if(file.endsWith(Option::lex_ext))
            where = "LEXSOURCES";
        else if(file.endsWith(Option::yacc_ext))
            where = "YACCSOURCES";
        else if(file.endsWith(".ts") || file.endsWith(".xlf"))
            where = "TRANSLATIONS";
        else if(file.endsWith(".qrc"))
            where = "RESOURCES";
    }

    QString newfile = fixPathToQmake(fileFixify(file));

    ProStringList &endList = project->values(where);
    if(!endList.contains(newfile, Qt::CaseInsensitive)) {
        endList += newfile;
        return true;
    }
    return false;
}